

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DSU_TEST.cpp
# Opt level: O2

void __thiscall
Valid_test_case_DSU_DSU_unit_test_Test::TestBody(Valid_test_case_DSU_DSU_unit_test_Test *this)

{
  int iVar1;
  int iVar2;
  char *in_R9;
  AssertHelper local_70;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_68;
  DSU dsu;
  string local_48;
  AssertionResult gtest_ar_;
  
  DSU::DSU(&dsu);
  DSU::unionSet(&dsu,1,2);
  DSU::unionSet(&dsu,3,4);
  DSU::unionSet(&dsu,5,6);
  DSU::unionSet(&dsu,1,4);
  iVar1 = DSU::find(&dsu,4);
  iVar2 = DSU::find(&dsu,1);
  gtest_ar_.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
  ;
  gtest_ar_.success_ = iVar1 == iVar2;
  if (!gtest_ar_.success_) {
    testing::Message::Message((Message *)&local_68);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_48,(internal *)&gtest_ar_,(AssertionResult *)"dsu.find(4) == dsu.find(1)",
               "false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_70,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/nploi[P]Cplusplus/Data Structures and Algorithms/Data structures/Disjoint-set-union/DSU_TEST.cpp"
               ,0x10,local_48._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_70,(Message *)&local_68);
    testing::internal::AssertHelper::~AssertHelper(&local_70);
    std::__cxx11::string::~string((string *)&local_48);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_68);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_.message_);
  DSU::~DSU(&dsu);
  return;
}

Assistant:

TEST(Valid_test_case_DSU, DSU_unit_test){
    DSU dsu;
    dsu.unionSet(1, 2);
    dsu.unionSet(3, 4);
    dsu.unionSet(5, 6);
    dsu.unionSet(1, 4);

    ASSERT_TRUE(dsu.find(4) == dsu.find(1));
}